

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O3

void __thiscall xLearn::DMatrix::ReAlloc(DMatrix *this,size_t length,bool label)

{
  value_type local_30;
  
  Reset(this);
  this->hash_value_1 = 0;
  this->hash_value_2 = 0;
  this->row_length = (index_t)length;
  local_30 = (value_type)0x0;
  std::
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  ::resize(&this->row,length,&local_30);
  local_30 = (value_type)((ulong)local_30 & 0xffffffff00000000);
  std::vector<float,_std::allocator<float>_>::resize(&this->Y,length,(value_type *)&local_30);
  local_30 = (value_type)CONCAT44(local_30._4_4_,0x3f800000);
  std::vector<float,_std::allocator<float>_>::resize(&this->norm,length,(value_type *)&local_30);
  this->has_label = label;
  this->pos = 0;
  return;
}

Assistant:

void ReAlloc(size_t length, bool label = true) {
    CHECK_GE(length, 0);
    this->Reset();
    this->hash_value_1 = 0;
    this->hash_value_2 = 0;
    this->row_length = length;
    this->row.resize(length, nullptr);
    this->Y.resize(length, 0);
    // Here we set norm to 1.0 by default, which means
    // that we don't use instance-wise normalization
    this->norm.resize(length, 1.0);
    // Indicate that if current dataset has the label y
    this->has_label = label;
    this->pos = 0;
  }